

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
          (EpsCopyOutputStream *this,uint32_t num,string *s,uint8_t *ptr)

{
  ulong uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  byte *pbVar4;
  uint size;
  uint extraout_EDX;
  uint uVar5;
  undefined4 in_register_00000034;
  byte *ptr_00;
  
  puVar2 = (uint8_t *)CONCAT44(in_register_00000034,num);
  ptr_00 = ptr;
  if (this->end_ <= ptr) {
    ptr_00 = EnsureSpaceFallback(this,ptr);
    puVar2 = ptr;
  }
  if (ptr_00 < this->end_) {
    uVar1 = s->_M_string_length;
    size = (uint)uVar1;
    uVar3 = (ulong)(num * 8 + 2);
    if (0x7f < num << 3) {
      do {
        uVar5 = (uint)uVar3;
        *ptr_00 = (byte)uVar3 | 0x80;
        uVar3 = uVar3 >> 7;
        ptr_00 = ptr_00 + 1;
      } while (0x3fff < uVar5);
    }
    *ptr_00 = (byte)uVar3;
    pbVar4 = ptr_00 + 1;
    uVar3 = uVar1 & 0xffffffff;
    if (0x7f < size) {
      do {
        ptr_00 = pbVar4;
        uVar5 = (uint)uVar3;
        *ptr_00 = (byte)uVar3 | 0x80;
        uVar3 = uVar3 >> 7;
        pbVar4 = ptr_00 + 1;
      } while (0x3fff < uVar5);
    }
    ptr_00 = ptr_00 + 2;
    *pbVar4 = (byte)uVar3;
    puVar2 = (uint8_t *)(s->_M_dataplus)._M_p;
    if ((long)(int)size <= (long)this->end_ - (long)ptr_00) {
      memcpy(ptr_00,puVar2,uVar1 & 0xffffffff);
      return ptr_00 + (int)size;
    }
  }
  else {
    WriteStringOutline((EpsCopyOutputStream *)&stack0xffffffffffffffd0);
    size = extraout_EDX;
  }
  puVar2 = WriteRawFallback(this,puVar2,size,ptr_00);
  return puVar2;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteStringOutline(uint32_t num, const std::string& s,
                                               uint8_t* ptr) {
  ptr = EnsureSpace(ptr);
  uint32_t size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRaw(s.data(), size, ptr);
}